

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

int xmlListAppend(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  _xmlLink *p_Var4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  int iVar7;
  xmlLinkPtr pxVar8;
  
  iVar7 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar8 = l->sentinel;
    do {
      pxVar8 = pxVar8->prev;
      if (pxVar8 == l->sentinel) break;
      iVar3 = (*l->linkCompare)(pxVar8->data,data);
    } while (0 < iVar3);
    p_Var4 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var4 == (_xmlLink *)0x0) {
      pp_Var5 = __xmlGenericError();
      p_Var2 = *pp_Var5;
      ppvVar6 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar6,"Cannot initialize memory for new link");
    }
    else {
      p_Var4->data = data;
      p_Var1 = pxVar8->next;
      p_Var4->next = p_Var1;
      p_Var1->prev = p_Var4;
      pxVar8->next = p_Var4;
      p_Var4->prev = pxVar8;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (1);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}